

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O1

void __thiscall TasGrid::TasmanianSparseGrid::TasmanianSparseGrid(TasmanianSparseGrid *this)

{
  _Head_base<0UL,_TasGrid::AccelerationContext_*,_false> _Var1;
  
  _Var1._M_head_impl = (AccelerationContext *)operator_new(0x18);
  (_Var1._M_head_impl)->mode = accel_none;
  (_Var1._M_head_impl)->algorithm_select = algorithm_autoselect;
  (_Var1._M_head_impl)->device = 0;
  ((_Var1._M_head_impl)->engine)._M_t =
       (__uniq_ptr_data<TasGrid::GpuEngine,_std::default_delete<TasGrid::GpuEngine>,_true,_true>)0x0
  ;
  (this->acceleration)._M_t.
  super___uniq_ptr_impl<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::AccelerationContext_*,_std::default_delete<TasGrid::AccelerationContext>_>
  .super__Head_base<0UL,_TasGrid::AccelerationContext_*,_false>._M_head_impl = _Var1._M_head_impl;
  (this->acc_domain)._M_t.
  super___uniq_ptr_impl<TasGrid::AccelerationDomainTransform,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::AccelerationDomainTransform_*,_std::default_delete<TasGrid::AccelerationDomainTransform>_>
  .super__Head_base<0UL,_TasGrid::AccelerationDomainTransform_*,_false>._M_head_impl =
       (AccelerationDomainTransform *)0x0;
  (this->base)._M_t.
  super___uniq_ptr_impl<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
  ._M_t.
  super__Tuple_impl<0UL,_TasGrid::BaseCanonicalGrid_*,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
  .super__Head_base<0UL,_TasGrid::BaseCanonicalGrid_*,_false>._M_head_impl =
       (BaseCanonicalGrid *)0x0;
  (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->domain_transform_a).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->domain_transform_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->domain_transform_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->domain_transform_b).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->conformal_asin_power).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->conformal_asin_power).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->conformal_asin_power).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->llimits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

TasmanianSparseGrid::TasmanianSparseGrid() : acceleration(Utils::make_unique<AccelerationContext>()), using_dynamic_construction(false){}